

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLString.cpp
# Opt level: O0

void xercesc_4_0::XMLString::removeWS(XMLCh *toConvert,MemoryManager *param_2)

{
  XMLCh *local_28;
  XMLCh *startPtr;
  XMLCh *retPtr;
  MemoryManager *param_1_local;
  XMLCh *toConvert_local;
  
  if ((toConvert != (XMLCh *)0x0) &&
     (local_28 = toConvert, startPtr = toConvert, *toConvert != L'\0')) {
    for (; *local_28 != L'\0'; local_28 = local_28 + 1) {
      if ((((*local_28 != L'\r') && (*local_28 != L'\n')) && (*local_28 != L'\t')) &&
         (*local_28 != L' ')) {
        *startPtr = *local_28;
        startPtr = startPtr + 1;
      }
    }
    *startPtr = L'\0';
  }
  return;
}

Assistant:

void XMLString::removeWS(XMLCh* toConvert, MemoryManager* const)
{
    // If no string, then its a failure
    if (( !toConvert ) || ( !*toConvert ))
        return;

    XMLCh* retPtr = toConvert;
    XMLCh* startPtr = toConvert;

    while (*startPtr)
    {
        if ( ( *startPtr != chCR)    &&
             ( *startPtr != chLF)    &&
             ( *startPtr != chHTab)  &&
             ( *startPtr != chSpace)  )
        {
            *retPtr++ = *startPtr;
        }

        startPtr++;
    }

    *retPtr = chNull;
}